

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

void pack_grammar(void)

{
  arg_cache *paVar1;
  Yshort *pYVar2;
  Yshort *pYVar3;
  bucket **__ptr;
  bucket **__ptr_00;
  bucket *pbVar4;
  long lVar5;
  char cVar6;
  arg_cache *__ptr_01;
  Yshort YVar7;
  ulong uVar8;
  int iVar9;
  int i;
  
  ritem = (Yshort *)allocate(nitems << 2);
  if (ritem == (Yshort *)0x0) {
    no_space();
  }
  rlhs = (Yshort *)allocate(nrules << 2);
  if (rlhs == (Yshort *)0x0) {
    no_space();
  }
  rrhs = (Yshort *)allocate(nrules * 4 + 4);
  if (rrhs == (Yshort *)0x0) {
    no_space();
  }
  rprec = (Yshort *)realloc(rprec,(ulong)(uint)(nrules << 2));
  if (rprec == (Yshort *)0x0) {
    no_space();
  }
  rassoc = (char *)realloc(rassoc,(ulong)(uint)nrules);
  if (rassoc == (char *)0x0) {
    no_space();
  }
  pYVar2 = ritem;
  *ritem = -1;
  pYVar2[1] = goal->index;
  pYVar2[2] = 0;
  pYVar3 = rlhs;
  pYVar2[3] = -2;
  pYVar2 = rlhs;
  pYVar2[0] = 0;
  pYVar2[1] = 0;
  pYVar3[2] = start_symbol;
  pYVar2 = rrhs;
  pYVar2[0] = 0;
  pYVar2[1] = 0;
  pYVar2[2] = 1;
  __ptr_00 = plhs;
  __ptr = pitem;
  lVar5 = 4;
  uVar8 = 3;
  while( true ) {
    iVar9 = (int)lVar5;
    if ((long)nrules <= (long)uVar8) break;
    pbVar4 = __ptr_00[uVar8];
    if (0 < pbVar4->args) {
      if (pbVar4->argnames != (char **)0x0) {
        free(pbVar4->argnames);
        __ptr_00[uVar8]->argnames = (char **)0x0;
        pbVar4 = __ptr_00[uVar8];
      }
      if (pbVar4->argtags != (char **)0x0) {
        free(pbVar4->argtags);
        __ptr_00[uVar8]->argtags = (char **)0x0;
        pbVar4 = __ptr_00[uVar8];
      }
    }
    rlhs[uVar8] = pbVar4->index;
    rrhs[uVar8] = iVar9;
    pYVar2 = ritem;
    cVar6 = '\0';
    YVar7 = 0;
    for (lVar5 = 0; pbVar4 = __ptr[iVar9 + lVar5], pbVar4 != (bucket *)0x0; lVar5 = lVar5 + 1) {
      pYVar2[iVar9 + lVar5] = pbVar4->index;
      if (pbVar4->class == '\x01') {
        YVar7 = pbVar4->prec;
        cVar6 = pbVar4->assoc;
      }
    }
    pYVar2[iVar9 + lVar5] = -(int)uVar8;
    if (rprec[uVar8] == -1) {
      rprec[uVar8] = YVar7;
      rassoc[uVar8] = cVar6;
    }
    lVar5 = (ulong)(iVar9 + 1) + lVar5;
    uVar8 = uVar8 + 1;
  }
  rrhs[uVar8 & 0xffffffff] = iVar9;
  free(__ptr_00);
  free(__ptr);
  for (lVar5 = 0; lVar5 != 0x400; lVar5 = lVar5 + 1) {
    __ptr_01 = arg_cache[lVar5];
    while (__ptr_01 != (arg_cache *)0x0) {
      free(__ptr_01->code);
      paVar1 = __ptr_01->next;
      free(__ptr_01);
      __ptr_01 = paVar1;
    }
    arg_cache[lVar5] = (arg_cache *)0x0;
  }
  return;
}

Assistant:

void pack_grammar()
{
    register int i, j;
    int assoc, prec;

    ritem = NEW2(nitems, Yshort);
    if (ritem == 0) no_space();
    rlhs = NEW2(nrules, Yshort);
    if (rlhs == 0) no_space();
    rrhs = NEW2(nrules+1, Yshort);
    if (rrhs == 0) no_space();
    rprec = RENEW(rprec, nrules, Yshort);
    if (rprec == 0) no_space();
    rassoc = RENEW(rassoc, nrules, char);
    if (rassoc == 0) no_space();

    ritem[0] = -1;
    ritem[1] = goal->index;
    ritem[2] = 0;
    ritem[3] = -2;
    rlhs[0] = 0;
    rlhs[1] = 0;
    rlhs[2] = start_symbol;
    rrhs[0] = 0;
    rrhs[1] = 0;
    rrhs[2] = 1;

    j = 4;
    for (i = 3; i < nrules; ++i) {
	if (plhs[i]->args > 0) {
	  if (plhs[i]->argnames) {
	    FREE(plhs[i]->argnames);
	    plhs[i]->argnames = 0;
	  }
	  if (plhs[i]->argtags) {
	    FREE(plhs[i]->argtags);
	    plhs[i]->argtags = 0;
	  }
	}
	rlhs[i] = plhs[i]->index;
	rrhs[i] = j;
	assoc = TOKEN;
	prec = 0;
	while (pitem[j]) {
	    ritem[j] = pitem[j]->index;
	    if (pitem[j]->class == TERM) {
		prec = pitem[j]->prec;
		assoc = pitem[j]->assoc; }
	    ++j; }
	ritem[j] = -i;
	++j;
	if (rprec[i] == UNDEFINED) {
	    rprec[i] = prec;
	    rassoc[i] = assoc; } }
    rrhs[i] = j;
    FREE(plhs);
    FREE(pitem);
    clean_arg_cache();
}